

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void decompose(uint32_t n)

{
  ulong uVar1;
  bool bVar2;
  
  printf("%u = ",n);
  if (n != 0) {
    uVar1 = 0;
    do {
      printf("%d*10^%d",(ulong)(n % 10),uVar1);
      if (9 < n) {
        printf(" + ");
      }
      uVar1 = (ulong)((int)uVar1 + 1);
      bVar2 = 9 < n;
      n = n / 10;
    } while (bVar2);
  }
  putchar(10);
  return;
}

Assistant:

void decompose(uint32_t n) {
  printf("%" PRIu32 " = ", n);
  for (int i = 0; n; i++) {
    printf("%d*10^%d", n % 10, i);
    n /= 10;
    if (n) printf(" + ");
  }
  printf("\n");
}